

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSynchronizationOperation.cpp
# Opt level: O0

void __thiscall
vkt::synchronization::anon_unknown_0::IndirectBuffer::GraphicsPipeline::recordCommands
          (GraphicsPipeline *this,OperationContext *context,VkCommandBuffer cmdBuffer,
          VkDescriptorSet descriptorSet)

{
  VkRenderPass renderPass;
  undefined4 uVar1;
  VkImageSubresourceRange subresourceRange;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined8 uVar5;
  VkIndexType VVar6;
  Image *this_00;
  VkImage *pVVar7;
  Handle<(vk::HandleType)17> *pHVar8;
  Handle<(vk::HandleType)23> *pHVar9;
  Handle<(vk::HandleType)18> *pHVar10;
  Handle<(vk::HandleType)16> *pHVar11;
  VkBuffer VVar12;
  deUint64 local_e8;
  VkBuffer vertexBuffer;
  VkDeviceSize vertexBufferOffset;
  undefined1 local_b8 [8];
  Vec4 clearColor;
  VkRect2D renderArea;
  undefined1 local_78 [8];
  VkImageMemoryBarrier colorAttachmentLayoutBarrier;
  DeviceInterface *vk;
  VkCommandBuffer cmdBuffer_local;
  OperationContext *context_local;
  GraphicsPipeline *this_local;
  VkDescriptorSet descriptorSet_local;
  
  this_local = (GraphicsPipeline *)descriptorSet.m_internal;
  colorAttachmentLayoutBarrier._64_8_ = OperationContext::getDeviceInterface(context);
  this_00 = de::details::
            UniqueBase<vkt::synchronization::Image,_de::DefaultDeleter<vkt::synchronization::Image>_>
            ::operator*(&(this->m_colorAttachmentImage).
                         super_UniqueBase<vkt::synchronization::Image,_de::DefaultDeleter<vkt::synchronization::Image>_>
                       );
  pVVar7 = synchronization::Image::operator*(this_00);
  uVar1 = (this->m_colorImageSubresourceRange).baseArrayLayer;
  uVar2 = (this->m_colorImageSubresourceRange).aspectMask;
  uVar3 = (this->m_colorImageSubresourceRange).baseMipLevel;
  uVar4 = (this->m_colorImageSubresourceRange).levelCount;
  subresourceRange.levelCount = uVar4;
  subresourceRange.baseMipLevel = uVar3;
  subresourceRange.aspectMask = uVar2;
  subresourceRange.baseArrayLayer = uVar1;
  subresourceRange.layerCount = (this->m_colorImageSubresourceRange).layerCount;
  makeImageMemoryBarrier
            ((VkImageMemoryBarrier *)local_78,0,0x100,VK_IMAGE_LAYOUT_UNDEFINED,
             VK_IMAGE_LAYOUT_COLOR_ATTACHMENT_OPTIMAL,(VkImage)pVVar7->m_internal,subresourceRange);
  (**(code **)(*(long *)colorAttachmentLayoutBarrier._64_8_ + 0x368))
            (colorAttachmentLayoutBarrier._64_8_,cmdBuffer,1,0x80,0,0,0,0,0,1,
             (VkImageMemoryBarrier *)local_78);
  clearColor.m_data._8_8_ = ::vk::makeOffset2D(0,0);
  ::vk::makeExtent2D((this->m_colorImageExtent).width,(this->m_colorImageExtent).height);
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)local_b8,0.0,0.0,0.0,1.0);
  uVar5 = colorAttachmentLayoutBarrier._64_8_;
  pHVar8 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)17>_>::operator*
                     (&(this->m_renderPass).super_RefBase<vk::Handle<(vk::HandleType)17>_>);
  renderPass.m_internal = pHVar8->m_internal;
  pHVar9 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)23>_>::operator*
                     (&(this->m_framebuffer).super_RefBase<vk::Handle<(vk::HandleType)23>_>);
  beginRenderPass((DeviceInterface *)uVar5,cmdBuffer,renderPass,(VkFramebuffer)pHVar9->m_internal,
                  (VkRect2D *)(clearColor.m_data + 2),(Vector<float,_4> *)local_b8);
  uVar5 = colorAttachmentLayoutBarrier._64_8_;
  pHVar10 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)18>_>::operator*
                      (&(this->m_pipeline).super_RefBase<vk::Handle<(vk::HandleType)18>_>);
  (**(code **)(*(long *)uVar5 + 0x260))(uVar5,cmdBuffer,0,pHVar10->m_internal);
  uVar5 = colorAttachmentLayoutBarrier._64_8_;
  pHVar11 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)16>_>::operator*
                      (&(this->m_pipelineLayout).super_RefBase<vk::Handle<(vk::HandleType)16>_>);
  (**(code **)(*(long *)uVar5 + 0x2b0))(uVar5,cmdBuffer,0,pHVar11->m_internal,0,1,&this_local,0,0);
  vertexBuffer.m_internal = 0;
  local_e8 = (deUint64)VertexGrid::getVertexBuffer(&this->m_vertices);
  (**(code **)(*(long *)colorAttachmentLayoutBarrier._64_8_ + 0x2c0))
            (colorAttachmentLayoutBarrier._64_8_,cmdBuffer,0,1,&local_e8,&vertexBuffer);
  uVar5 = colorAttachmentLayoutBarrier._64_8_;
  if (this->m_resourceType == RESOURCE_TYPE_INDIRECT_BUFFER_DRAW) {
    (**(code **)(*(long *)colorAttachmentLayoutBarrier._64_8_ + 0x2d8))
              (colorAttachmentLayoutBarrier._64_8_,cmdBuffer,(this->m_indirectBuffer).m_internal,0,1
               ,0);
  }
  else if (this->m_resourceType == RESOURCE_TYPE_INDIRECT_BUFFER_DRAW_INDEXED) {
    VVar12 = VertexGrid::getIndexBuffer(&this->m_vertices);
    VVar6 = VertexGrid::getIndexType(&this->m_vertices);
    (**(code **)(*(long *)uVar5 + 0x2b8))(uVar5,cmdBuffer,VVar12.m_internal,0,VVar6);
    (**(code **)(*(long *)colorAttachmentLayoutBarrier._64_8_ + 0x2e0))
              (colorAttachmentLayoutBarrier._64_8_,cmdBuffer,(this->m_indirectBuffer).m_internal,0,1
               ,0);
  }
  endRenderPass((DeviceInterface *)colorAttachmentLayoutBarrier._64_8_,cmdBuffer);
  return;
}

Assistant:

void recordCommands (OperationContext& context, const VkCommandBuffer cmdBuffer, const VkDescriptorSet descriptorSet)
	{
		const DeviceInterface&	vk	= context.getDeviceInterface();

		// Change color attachment image layout
		{
			const VkImageMemoryBarrier colorAttachmentLayoutBarrier = makeImageMemoryBarrier(
				(VkAccessFlags)0, VK_ACCESS_COLOR_ATTACHMENT_WRITE_BIT,
				VK_IMAGE_LAYOUT_UNDEFINED, VK_IMAGE_LAYOUT_COLOR_ATTACHMENT_OPTIMAL,
				**m_colorAttachmentImage, m_colorImageSubresourceRange);

			vk.cmdPipelineBarrier(cmdBuffer, VK_PIPELINE_STAGE_TOP_OF_PIPE_BIT, VK_PIPELINE_STAGE_FRAGMENT_SHADER_BIT, (VkDependencyFlags)0,
				0u, DE_NULL, 0u, DE_NULL, 1u, &colorAttachmentLayoutBarrier);
		}

		{
			const VkRect2D renderArea = {
				makeOffset2D(0, 0),
				makeExtent2D(m_colorImageExtent.width, m_colorImageExtent.height),
			};
			const tcu::Vec4 clearColor = tcu::Vec4(0.0f, 0.0f, 0.0f, 1.0f);

			beginRenderPass(vk, cmdBuffer, *m_renderPass, *m_framebuffer, renderArea, clearColor);
		}

		vk.cmdBindPipeline(cmdBuffer, VK_PIPELINE_BIND_POINT_GRAPHICS, *m_pipeline);
		vk.cmdBindDescriptorSets(cmdBuffer, VK_PIPELINE_BIND_POINT_GRAPHICS, *m_pipelineLayout, 0u, 1u, &descriptorSet, 0u, DE_NULL);
		{
			const VkDeviceSize	vertexBufferOffset	= 0ull;
			const VkBuffer		vertexBuffer		= m_vertices.getVertexBuffer();
			vk.cmdBindVertexBuffers(cmdBuffer, 0u, 1u, &vertexBuffer, &vertexBufferOffset);
		}

		switch (m_resourceType)
		{
			case RESOURCE_TYPE_INDIRECT_BUFFER_DRAW:
				vk.cmdDrawIndirect(cmdBuffer, m_indirectBuffer, 0u, 1u, 0u);
				break;

			case RESOURCE_TYPE_INDIRECT_BUFFER_DRAW_INDEXED:
				vk.cmdBindIndexBuffer(cmdBuffer, m_vertices.getIndexBuffer(), 0u, m_vertices.getIndexType());
				vk.cmdDrawIndexedIndirect(cmdBuffer, m_indirectBuffer, 0u, 1u, 0u);
				break;

			default:
				DE_ASSERT(0);
				break;
		}
		endRenderPass(vk, cmdBuffer);
	}